

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_h264e_vepu510.c
# Opt level: O0

void setup_vepu510_split(H265eV510RegSet *regs,MppEncCfgSet *enc_cfg,RK_U32 title_en)

{
  RK_U32 RVar1;
  int iVar2;
  uint uVar3;
  RK_U32 slice_num;
  RK_U32 mb_h;
  RK_U32 mb_w;
  MppEncSliceSplit *cfg;
  RK_U32 title_en_local;
  MppEncCfgSet *enc_cfg_local;
  H265eV510RegSet *regs_local;
  
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","enter\n","setup_vepu510_split");
  }
  RVar1 = (enc_cfg->split).split_mode;
  if (RVar1 == 0) {
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xfffffffe)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xfffffffd)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xfffffffb)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0x8000ffff)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xffff7fff)
    ;
    (regs->reg_frm).common.sli_cnum =
         (anon_struct_4_2_b2023a6e_for_sli_cnum)((uint)(regs->reg_frm).common.sli_cnum & 0xfff00000)
    ;
    (regs->reg_frm).common.sli_byte =
         (anon_struct_4_2_c5c57e2e_for_sli_byte)((uint)(regs->reg_frm).common.sli_byte & 0xfff00000)
    ;
    (regs->reg_frm).common.enc_pic =
         (anon_struct_4_11_8ae7a56b_for_enc_pic)((uint)(regs->reg_frm).common.enc_pic & 0xbfffffff);
  }
  else if (RVar1 == 1) {
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0xfffffffe | 1);
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xfffffffd)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xfffffffb)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0x8000ffff | 0x1f40000);
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0xffff7fff | 0x8000);
    (regs->reg_frm).common.sli_cnum =
         (anon_struct_4_2_b2023a6e_for_sli_cnum)((uint)(regs->reg_frm).common.sli_cnum & 0xfff00000)
    ;
    (regs->reg_frm).common.sli_byte =
         (anon_struct_4_2_c5c57e2e_for_sli_byte)
         ((uint)(regs->reg_frm).common.sli_byte & 0xfff00000 | (enc_cfg->split).split_arg & 0xfffff)
    ;
    (regs->reg_frm).common.enc_pic =
         (anon_struct_4_11_8ae7a56b_for_enc_pic)
         ((uint)(regs->reg_frm).common.enc_pic & 0xbfffffff |
         (uint)((enc_cfg->split).split_out != 0) << 0x1e);
    (regs->reg_ctl).int_en =
         (anon_struct_4_17_ceafadd1_for_int_en)
         ((uint)(regs->reg_ctl).int_en & 0xfffffff7 |
         ((uint)(regs->reg_frm).common.enc_pic >> 0x1e & 1) << 3);
  }
  else if (RVar1 == 2) {
    slice_num = (RK_U32)((long)((long)((enc_cfg->prep).width + 0x1f) & 0xffffffffffffffe0U) / 0x20);
    iVar2 = (enc_cfg->prep).height;
    if (title_en != 0) {
      slice_num = slice_num >> 1;
    }
    RVar1 = (enc_cfg->split).split_arg;
    uVar3 = (enc_cfg->split).split_arg;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0xfffffffe | 1);
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0xfffffffd | 2);
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)((uint)(regs->reg_frm).common.sli_splt & 0xfffffffb)
    ;
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0x8000ffff | 0x1f40000);
    (regs->reg_frm).common.sli_splt =
         (anon_struct_4_7_46df3407_for_sli_splt)
         ((uint)(regs->reg_frm).common.sli_splt & 0xffff7fff | 0x8000);
    (regs->reg_frm).common.sli_cnum =
         (anon_struct_4_2_b2023a6e_for_sli_cnum)
         ((uint)(regs->reg_frm).common.sli_cnum & 0xfff00000 |
         (enc_cfg->split).split_arg - 1 & 0xfffff);
    (regs->reg_frm).common.sli_byte =
         (anon_struct_4_2_c5c57e2e_for_sli_byte)((uint)(regs->reg_frm).common.sli_byte & 0xfff00000)
    ;
    (regs->reg_frm).common.enc_pic =
         (anon_struct_4_11_8ae7a56b_for_enc_pic)
         ((uint)(regs->reg_frm).common.enc_pic & 0xbfffffff |
         (uint)((enc_cfg->split).split_out != 0) << 0x1e);
    if ((((enc_cfg->split).split_out & 1) != 0) ||
       ((((uint)(regs->reg_frm).common.enc_pic >> 0x1e & 1) != 0 &&
        (8 < ((slice_num * (int)((long)((long)(iVar2 + 0x1f) & 0xffffffffffffffe0U) / 0x20) + RVar1)
             - 1) / uVar3)))) {
      (regs->reg_ctl).int_en =
           (anon_struct_4_17_ceafadd1_for_int_en)((uint)(regs->reg_ctl).int_en & 0xfffffff7 | 8);
    }
  }
  else {
    _mpp_log_l(4,"hal_h265e_v510","invalide slice split mode %d\n","setup_vepu510_split",
               (ulong)(enc_cfg->split).split_mode);
  }
  (enc_cfg->split).change = 0;
  if ((hal_h265e_debug & 1) != 0) {
    _mpp_log_l(4,"hal_h265e_v510","leave\n","setup_vepu510_split");
  }
  return;
}

Assistant:

static void setup_vepu510_split(HalVepu510RegSet *regs, MppEncCfgSet *enc_cfg)
{
    H264eVepu510Frame *reg_frm = &regs->reg_frm;
    MppEncSliceSplit *cfg = &enc_cfg->split;

    hal_h264e_dbg_func("enter\n");

    switch (cfg->split_mode) {
    case MPP_ENC_SPLIT_NONE : {
        reg_frm->common.sli_splt.sli_splt         = 0;
        reg_frm->common.sli_splt.sli_splt_mode    = 0;
        reg_frm->common.sli_splt.sli_splt_cpst    = 0;
        reg_frm->common.sli_splt.sli_max_num_m1   = 0;
        reg_frm->common.sli_splt.sli_flsh         = 0;
        reg_frm->common.sli_cnum.sli_splt_cnum_m1 = 0;

        reg_frm->common.sli_byte.sli_splt_byte    = 0;
        reg_frm->common.enc_pic.slen_fifo         = 0;
    } break;
    case MPP_ENC_SPLIT_BY_BYTE : {
        reg_frm->common.sli_splt.sli_splt         = 1;
        reg_frm->common.sli_splt.sli_splt_mode    = 0;
        reg_frm->common.sli_splt.sli_splt_cpst    = 0;
        reg_frm->common.sli_splt.sli_max_num_m1   = 500;
        reg_frm->common.sli_splt.sli_flsh         = 1;
        reg_frm->common.sli_cnum.sli_splt_cnum_m1 = 0;

        reg_frm->common.sli_byte.sli_splt_byte    = cfg->split_arg;
        reg_frm->common.enc_pic.slen_fifo         = cfg->split_out ? 1 : 0;
        regs->reg_ctl.int_en.vslc_done_en         = reg_frm->common.enc_pic.slen_fifo;
    } break;
    case MPP_ENC_SPLIT_BY_CTU : {
        RK_U32 mb_w = MPP_ALIGN(enc_cfg->prep.width, 16) / 16;
        RK_U32 mb_h = MPP_ALIGN(enc_cfg->prep.height, 16) / 16;
        RK_U32 slice_num = (mb_w * mb_h + cfg->split_arg - 1) / cfg->split_arg;

        reg_frm->common.sli_splt.sli_splt         = 1;
        reg_frm->common.sli_splt.sli_splt_mode    = 1;
        reg_frm->common.sli_splt.sli_splt_cpst    = 0;
        reg_frm->common.sli_splt.sli_max_num_m1   = 500;
        reg_frm->common.sli_splt.sli_flsh         = 1;
        reg_frm->common.sli_cnum.sli_splt_cnum_m1 = cfg->split_arg - 1;

        reg_frm->common.sli_byte.sli_splt_byte    = 0;
        reg_frm->common.enc_pic.slen_fifo         = cfg->split_out ? 1 : 0;
        if ((cfg->split_out & MPP_ENC_SPLIT_OUT_LOWDELAY) ||
            (regs->reg_frm.common.enc_pic.slen_fifo && (slice_num > VEPU510_SLICE_FIFO_LEN)))
            regs->reg_ctl.int_en.vslc_done_en = 1;
    } break;
    default : {
        mpp_log_f("invalide slice split mode %d\n", cfg->split_mode);
    } break;
    }
    cfg->change = 0;

    hal_h264e_dbg_func("leave\n");
}